

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O3

char * __thiscall
AccountingTestMemoryAllocator::alloc_memory
          (AccountingTestMemoryAllocator *this,size_t size,char *file,size_t line)

{
  int iVar1;
  int iVar2;
  MemoryAccountantAllocationNode *pMVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar5;
  AccountingTestMemoryAllocatorMemoryNode *pAVar4;
  
  pMVar3 = MemoryAccountant::findOrCreateNodeOfSize(this->accountant_,size);
  pMVar3->allocations_ = pMVar3->allocations_ + 1;
  uVar5 = pMVar3->currentAllocations_ + 1;
  pMVar3->currentAllocations_ = uVar5;
  if (uVar5 <= pMVar3->maxAllocations_) {
    uVar5 = pMVar3->maxAllocations_;
  }
  pMVar3->maxAllocations_ = uVar5;
  iVar1 = (*this->originalAllocator_->_vptr_TestMemoryAllocator[2])
                    (this->originalAllocator_,size,file,line);
  iVar2 = (*this->originalAllocator_->_vptr_TestMemoryAllocator[2])
                    (this->originalAllocator_,0x18,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/TestMemoryAllocator.cpp"
                     ,0x27b);
  pAVar4 = (AccountingTestMemoryAllocatorMemoryNode *)CONCAT44(extraout_var_00,iVar2);
  pAVar4->memory_ = (char *)CONCAT44(extraout_var,iVar1);
  pAVar4->size_ = size;
  pAVar4->next_ = this->head_;
  this->head_ = pAVar4;
  return (char *)CONCAT44(extraout_var,iVar1);
}

Assistant:

char* AccountingTestMemoryAllocator::alloc_memory(size_t size, const char* file, size_t line)
{
    accountant_.alloc(size);
    char* memory = originalAllocator_->alloc_memory(size, file, line);
    addMemoryToMemoryTrackingToKeepTrackOfSize(memory, size);
    return memory;
}